

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O2

void __thiscall
irr::video::CNullDriver::swapMaterialRenderers(CNullDriver *this,u32 idx1,u32 idx2,bool swapNames)

{
  pointer pSVar1;
  IMaterialRenderer *pIVar2;
  uint uVar3;
  
  pSVar1 = (this->MaterialRenderers).m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (uint)(((long)(this->MaterialRenderers).m_data.
                        super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x28);
  if (idx2 < uVar3 && idx1 < uVar3) {
    pIVar2 = pSVar1[idx1].Renderer;
    pSVar1[idx1].Renderer = pSVar1[idx2].Renderer;
    pSVar1[idx2].Renderer = pIVar2;
    if (swapNames) {
      pSVar1 = (this->MaterialRenderers).m_data.
               super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
               ._M_impl.super__Vector_impl_data._M_start;
      core::swap<irr::core::string<char>,irr::core::string<char>>
                (&pSVar1[idx1].Name,&pSVar1[idx2].Name);
      return;
    }
  }
  return;
}

Assistant:

void CNullDriver::swapMaterialRenderers(u32 idx1, u32 idx2, bool swapNames)
{
	if (idx1 < MaterialRenderers.size() && idx2 < MaterialRenderers.size()) {
		irr::core::swap(MaterialRenderers[idx1].Renderer, MaterialRenderers[idx2].Renderer);
		if (swapNames)
			irr::core::swap(MaterialRenderers[idx1].Name, MaterialRenderers[idx2].Name);
	}
}